

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

bsc_step_t bsc_sync(bsc_step_t until)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  bsp_pid_t bVar9;
  int iVar10;
  void *pvVar11;
  uint uVar12;
  void *pvVar13;
  uint uVar14;
  size_t sVar15;
  void *pvVar16;
  long lVar17;
  int iVar18;
  undefined8 *puVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  bsc_step_t local_6c;
  void *local_68;
  void *local_60;
  uint local_54;
  ulong local_50;
  long local_48;
  bsc_step_t local_40;
  undefined4 local_3c;
  size_t local_38;
  
  uVar8 = bsp_nprocs();
  if (DAT_0011e3b0 == (void *)0x0) {
    bVar9 = bsp_nprocs();
    pvVar11 = calloc((long)bVar9,4);
    DAT_0011e3b0 = pvVar11;
    bVar9 = bsp_nprocs();
    bsp_push_reg(pvVar11,bVar9 * 4);
    bsp_sync();
  }
  if (until == 0xffffffff || bsc_s_bsc < until) {
    uVar20 = (ulong)uVar8;
    local_38 = uVar20 * 4;
    local_54 = uVar8;
    local_50 = uVar20;
    local_40 = until;
    do {
      local_6c = until;
      if (uVar8 != 0) {
        memset(DAT_0011e3b0,0xff,local_38);
      }
      if (DAT_0011e38c != 0) {
        uVar20 = (ulong)DAT_0011e394;
        if (*(int *)(DAT_0011e398 + uVar20 * 4) != 0) {
          lVar23 = 0x50;
          uVar24 = 0;
          iVar18 = DAT_0011e390;
          do {
            lVar25 = (ulong)(uint)((int)uVar20 * iVar18) * 0x58 + DAT_0011e3a0;
            if (*(int *)(lVar23 + -0x50 + lVar25) == 3) {
              if (DAT_0011e3bc == 0) {
                hash_table_create((hash_table_t *)&DAT_0011e3b8,1000,collcoa_is_equal,collcoa_hash);
              }
              iVar18 = DAT_0011e424;
              if (DAT_0011e424 == DAT_0011e420) {
                sVar15 = (size_t)(uint)(DAT_0011e424 * 2);
                if (DAT_0011e424 < 0x1f5) {
                  sVar15 = 1000;
                }
                pvVar11 = calloc(sVar15,8);
                local_60 = calloc(sVar15,0x18);
                local_68 = pvVar11;
                if (pvVar11 == (void *)0x0 || local_60 == (void *)0x0) {
                  bsp_abort("bsc_sync: insufficient memory\n");
                  iVar18 = DAT_0011e424;
                }
                pvVar11 = DAT_0011e418;
                memcpy(local_68,DAT_0011e418,(long)iVar18 * 8);
                pvVar16 = local_60;
                memcpy(local_60,DAT_0011e430,(long)iVar18 * 0x18);
                free(pvVar11);
                free(DAT_0011e430);
                DAT_0011e418 = local_68;
                DAT_0011e430 = pvVar16;
                DAT_0011e420 = (int)sVar15;
              }
              pvVar16 = (void *)(lVar25 + lVar23 + -0x48);
              pvVar11 = hash_table_new_item((hash_table_t *)&DAT_0011e3b8,pvVar16);
              iVar18 = DAT_0011e390;
              if (pvVar16 == pvVar11) {
                lVar25 = (long)DAT_0011e424;
                if (DAT_0011e420 <= DAT_0011e424) {
                  __assert_fail("sbsc->collcoa_set_size < sbsc->collcoa_set_reserved",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsc.c"
                                ,0x112,"void expand_coll(coll_request_t *)");
                }
                DAT_0011e424 = DAT_0011e424 + 1;
                *(void **)((long)DAT_0011e418 + lVar25 * 8) = pvVar11;
              }
              else {
                *(undefined8 *)(lVar25 + lVar23) = *(undefined8 *)((long)pvVar11 + 0x48);
                *(void **)((long)pvVar11 + 0x48) = pvVar16;
              }
            }
            uVar24 = uVar24 + 1;
            uVar20 = (ulong)DAT_0011e394;
            lVar23 = lVar23 + 0x58;
          } while (uVar24 < *(uint *)(DAT_0011e398 + uVar20 * 4));
        }
        if (0 < DAT_0011e424) {
          pvVar13 = (void *)0x0;
          pvVar16 = (void *)0x0;
          pvVar11 = DAT_0011e430;
          iVar18 = DAT_0011e438;
          do {
            puVar19 = *(undefined8 **)((long)DAT_0011e418 + (long)pvVar13 * 8);
            local_48 = (long)pvVar13 * 3;
            *(undefined8 *)((long)pvVar11 + (long)pvVar13 * 0x18) = *puVar19;
            *(undefined8 *)((long)pvVar11 + (long)pvVar13 * 0x18 + 8) = puVar19[2];
            *(undefined4 *)((long)pvVar11 + (long)pvVar13 * 0x18 + 0x10) =
                 *(undefined4 *)(puVar19 + 1);
            iVar22 = 0;
            local_68 = pvVar16;
            local_60 = pvVar13;
            do {
              pvVar11 = DAT_0011e428;
              iVar10 = iVar22 + (int)pvVar16;
              if (iVar10 < iVar18) {
                lVar23 = (long)iVar10 * 0x30;
                uVar3 = puVar19[3];
                uVar4 = puVar19[4];
                uVar5 = puVar19[5];
                uVar6 = puVar19[6];
                uVar7 = puVar19[8];
                puVar1 = (undefined8 *)((long)DAT_0011e428 + lVar23 + 0x20);
                *puVar1 = puVar19[7];
                puVar1[1] = uVar7;
                puVar1 = (undefined8 *)((long)pvVar11 + lVar23 + 0x10);
                *puVar1 = uVar5;
                puVar1[1] = uVar6;
                puVar1 = (undefined8 *)((long)pvVar11 + lVar23);
                *puVar1 = uVar3;
                puVar1[1] = uVar4;
                puVar19 = (undefined8 *)puVar19[9];
                iVar22 = iVar22 + 1;
              }
              else {
                sVar15 = (size_t)(uint)(iVar18 * 2);
                if (iVar18 < 0x33) {
                  sVar15 = 100;
                }
                pvVar11 = calloc(sVar15,0x30);
                if (pvVar11 == (void *)0x0) {
                  bsp_abort("bsc_sync: insufficient memory\n");
                  iVar18 = DAT_0011e438;
                }
                pvVar16 = DAT_0011e428;
                memcpy(pvVar11,DAT_0011e428,(long)iVar18 * 0x30);
                free(pvVar16);
                DAT_0011e438 = (int)sVar15;
                pvVar16 = local_68;
                DAT_0011e428 = pvVar11;
              }
              iVar18 = DAT_0011e438;
              pvVar11 = DAT_0011e430;
            } while (puVar19 != (undefined8 *)0x0);
            *(int *)((long)DAT_0011e430 + local_48 * 8 + 0x14) = iVar22;
            pvVar16 = (void *)(ulong)(uint)((int)pvVar16 + iVar22);
            pvVar13 = (void *)((long)local_60 + 1);
          } while ((long)pvVar13 < (long)DAT_0011e424);
          if (0 < DAT_0011e424) {
            pvVar11 = (void *)0x0;
            iVar18 = 0;
            do {
              lVar23 = *(long *)((long)DAT_0011e430 + (long)pvVar11 * 0x18);
              uVar3 = *(undefined8 *)((long)DAT_0011e430 + (long)pvVar11 * 0x18 + 8);
              uVar2 = *(undefined4 *)((long)DAT_0011e430 + (long)pvVar11 * 0x18 + 0x10);
              iVar22 = *(int *)((long)DAT_0011e430 + (long)pvVar11 * 0x18 + 0x14);
              if (*(int *)(lVar23 + 0xf0) < 1) {
                lVar25 = 0;
                iVar10 = iVar18;
              }
              else {
                local_48 = CONCAT44(local_48._4_4_,iVar18);
                uVar20 = 0;
                uVar24 = 0;
                pvVar16 = (void *)0x7ff0000000000000;
                local_60 = pvVar11;
                local_3c = uVar2;
                do {
                  local_68 = pvVar16;
                  pvVar11 = (void *)(**(code **)(lVar23 + 0x50 + uVar20 * 8))
                                              (uVar3,(void *)((long)iVar18 * 0x30 +
                                                             (long)DAT_0011e428),iVar22);
                  pvVar16 = local_68;
                  if ((double)pvVar11 < (double)local_68) {
                    uVar24 = uVar20 & 0xffffffff;
                    pvVar16 = pvVar11;
                  }
                  uVar20 = uVar20 + 1;
                } while ((long)uVar20 < (long)*(int *)(lVar23 + 0xf0));
                lVar25 = (long)(int)uVar24;
                pvVar11 = local_60;
                iVar10 = (int)local_48;
                uVar2 = local_3c;
              }
              (**(code **)(lVar23 + lVar25 * 8))
                        (bsc_s_bsc,uVar2,uVar3,(void *)((long)iVar18 * 0x30 + (long)DAT_0011e428),
                         iVar22);
              iVar18 = iVar10 + iVar22;
              pvVar11 = (void *)((long)pvVar11 + 1);
            } while ((long)pvVar11 < (long)DAT_0011e424);
          }
        }
        hash_table_clear((hash_table_t *)&DAT_0011e3b8);
        until = local_40;
        uVar8 = local_54;
        DAT_0011e424 = 0;
        uVar20 = (ulong)DAT_0011e394;
        if (*(int *)(DAT_0011e398 + uVar20 * 4) == 0) {
          uVar12 = 0;
        }
        else {
          lVar23 = 0x18;
          uVar24 = 0;
          do {
            lVar25 = (ulong)(uint)((int)uVar20 * DAT_0011e390) * 0x58 + DAT_0011e3a0;
            iVar18 = *(int *)(lVar23 + -0x18 + lVar25);
            if (iVar18 == 1) {
              iVar18 = *(int *)(lVar25 + 4 + lVar23);
              bVar9 = bsp_pid();
              if (iVar18 != bVar9) {
                __assert_fail("r->payload.get.dst_pid == bsp_pid()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsc.c"
                              ,0x233,"bsc_step_t bsc_sync(bsc_step_t)");
              }
              bsp_get(*(bsp_pid_t *)(lVar25 + lVar23),*(void **)(lVar25 + -0x10 + lVar23),
                      *(bsp_size_t *)(lVar25 + 0xc + lVar23),*(void **)(lVar25 + -8 + lVar23),
                      *(bsp_size_t *)(lVar25 + 8 + lVar23));
            }
            else if (iVar18 == 0) {
              iVar18 = *(int *)(lVar25 + lVar23);
              bVar9 = bsp_pid();
              if (iVar18 != bVar9) {
                __assert_fail("r->payload.put.src_pid == bsp_pid()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsc.c"
                              ,0x22e,"bsc_step_t bsc_sync(bsc_step_t)");
              }
              bsp_put(*(bsp_pid_t *)(lVar25 + 4 + lVar23),*(void **)(lVar25 + -0x10 + lVar23),
                      *(void **)(lVar25 + -8 + lVar23),*(bsp_size_t *)(lVar25 + 0xc + lVar23),
                      *(bsp_size_t *)(lVar25 + 8 + lVar23));
            }
            uVar24 = uVar24 + 1;
            uVar20 = (ulong)DAT_0011e394;
            uVar12 = *(uint *)(DAT_0011e398 + uVar20 * 4);
            lVar23 = lVar23 + 0x58;
          } while (uVar24 < uVar12);
        }
        DAT_0011e3a8 = DAT_0011e3a8 - uVar12;
        uVar20 = local_50;
        if (DAT_0011e3a8 == 0) {
          local_6c = until;
        }
        else {
          uVar12 = 1;
          if (1 < DAT_0011e38c) {
            uVar14 = 1;
            do {
              uVar12 = uVar14;
              if (*(int *)(DAT_0011e398 + ((ulong)(DAT_0011e394 + uVar14) % (ulong)DAT_0011e38c) * 4
                          ) != 0) break;
              uVar14 = uVar14 + 1;
              uVar12 = DAT_0011e38c;
            } while (DAT_0011e38c != uVar14);
          }
          local_6c = uVar12 + bsc_s_bsc;
        }
      }
      uVar12 = until;
      if (local_6c == 0xffffffff || uVar8 == 0) {
        bsp_sync();
        local_6c = until;
        if (uVar8 != 0) goto LAB_00112149;
      }
      else {
        uVar14 = 0;
        do {
          pvVar11 = DAT_0011e3b0;
          bVar9 = bsp_pid();
          bsp_put(uVar14,&local_6c,pvVar11,bVar9 * 4,4);
          uVar14 = uVar14 + 1;
        } while (uVar8 != uVar14);
        bsp_sync();
        uVar20 = local_50;
LAB_00112149:
        uVar24 = 0;
        local_6c = until;
        do {
          uVar14 = *(uint *)((long)DAT_0011e3b0 + uVar24 * 4);
          if (uVar14 < uVar12) {
            uVar12 = uVar14;
            local_6c = uVar14;
          }
          uVar24 = uVar24 + 1;
        } while (uVar20 != uVar24);
      }
      if (DAT_0011e38c != 0) {
        uVar20 = (ulong)DAT_0011e394;
        lVar23 = DAT_0011e398;
        if (*(int *)(DAT_0011e398 + uVar20 * 4) != 0) {
          lVar17 = 0x18;
          uVar24 = 0;
          lVar25 = DAT_0011e3a0;
          iVar18 = DAT_0011e390;
          do {
            lVar21 = (ulong)(uint)(iVar18 * (int)uVar20) * 0x58 + lVar25;
            if (*(int *)(lVar17 + -0x18 + lVar21) == 2) {
              (**(code **)(lVar21 + -0x10 + lVar17))
                        (*(undefined8 *)(lVar21 + -8 + lVar17),*(undefined8 *)(lVar21 + lVar17),
                         *(undefined8 *)(lVar21 + 8 + lVar17),
                         *(undefined4 *)(lVar21 + 0x10 + lVar17));
              uVar20 = (ulong)DAT_0011e394;
              lVar23 = DAT_0011e398;
              lVar25 = DAT_0011e3a0;
              iVar18 = DAT_0011e390;
            }
            uVar24 = uVar24 + 1;
            lVar17 = lVar17 + 0x58;
          } while (uVar24 < *(uint *)(lVar23 + uVar20 * 4));
        }
        *(undefined4 *)(lVar23 + uVar20 * 4) = 0;
        DAT_0011e394 = ((DAT_0011e394 + local_6c) - bsc_s_bsc) % DAT_0011e38c;
        uVar20 = local_50;
        uVar12 = local_6c;
      }
      if (uVar12 == 0xffffffff) {
        if (DAT_0011e3a8 == 0) {
          bsc_s_bsc = 0;
          DAT_0011e394 = 0;
          return 0;
        }
        __assert_fail("sbsc->total_n_outstanding_requests == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsc.c"
                      ,0x267,"bsc_step_t bsc_sync(bsc_step_t)");
      }
      bsc_s_bsc = uVar12;
    } while (uVar12 < until);
  }
  return bsc_s_bsc;
}

Assistant:

bsc_step_t bsc_sync( bsc_step_t until )
{
    state_t * const sbsc = bsc();
    unsigned i, P = bsp_nprocs(), sz=sizeof(sbsc->next_step[0]);
    if ( !sbsc->next_step) {
        /* do some initialization */
        sbsc->next_step = calloc( bsp_nprocs(), sizeof(sbsc->next_step[0]));
        bsp_push_reg( sbsc->next_step, 
                bsp_nprocs() * sizeof(sbsc->next_step[0]) );
        bsp_sync();
    }

    while ( sbsc->current < until || until == bsc_flush ) {
        bsc_step_t common_step = until;
        for ( i = 0; i < P; ++i ) 
            sbsc->next_step[i] = bsc_flush;

        if (sbsc->horizon > 0) {
            /* expand all collectives */
            for ( i = 0; i < sbsc->n_requests[sbsc->queue_start]; ++i ) {
                 request_t * r = sbsc->queue + 
                    sbsc->queue_start * sbsc->max_requests_per_step + i ;
                 if ( r->kind == COLL ) {
                     expand_coll( & r->payload.coll );
                 }
            }
            /* and insert them in small pieces into the queue */
            schedule_colls();

            /* execute the delayed puts and gets */
            for ( i = 0; i < sbsc->n_requests[sbsc->queue_start]; ++i ) {
                 request_t * r = sbsc->queue + 
                    sbsc->queue_start * sbsc->max_requests_per_step + i ;
                 if ( r->kind == PUT ) {
                    assert( r->payload.put.src_pid == bsp_pid() ) ;
                    bsp_put( r->payload.put.dst_pid, 
                            r->payload.put.src_addr, r->payload.put.dst_addr, 
                            r->payload.put.offset, r->payload.put.size );
                 } else if ( r->kind == GET ) {
                    assert( r->payload.get.dst_pid == bsp_pid() ) ;
                    bsp_get( r->payload.get.src_pid, r->payload.get.src_addr,
                            r->payload.get.offset, r->payload.get.dst_addr, 
                            r->payload.get.size );
                 }
            }
            sbsc->total_n_outstanding_requests 
                -= sbsc->n_requests[ sbsc->queue_start ];

            /* search for the step this process can skip to */
            if ( 0 == sbsc->total_n_outstanding_requests ) {
                common_step = until;
            } else {
                for (common_step = 1; common_step < sbsc->horizon ; common_step++){
                    unsigned j = (sbsc->queue_start + common_step) % sbsc->horizon;
                    if ( sbsc->n_requests[j]  != 0 ) {
                        break;
                    }
                } 
                common_step += sbsc->current;
            }
        }

        if ( common_step != bsc_flush ) {
            for ( i = 0; i < P; ++i ) 
                bsp_put( i, &common_step, sbsc->next_step, bsp_pid()*sz, sz );
        }
        bsp_sync();
        common_step = until;
        for ( i = 0; i < P; ++i ) {
            if ( sbsc->next_step[i] < common_step )
                common_step = sbsc->next_step[i];
        }

        if (sbsc->horizon > 0) {
            /* execute the delayed local reduce operations */
            for ( i = 0; i < sbsc->n_requests[sbsc->queue_start]; ++i ) {
                request_t * r = sbsc->queue + 
                    sbsc->queue_start * sbsc->max_requests_per_step + i ;
                if ( r->kind == EXEC ) {
                    bsc_reduce_t f = r->payload.exec.func;
                    void * a = r->payload.exec.a;
                    const void * a0 = r->payload.exec.a0 ;
                    const void * xs = r->payload.exec.xs;
                    bsc_size_t size = r->payload.exec.size;
                    (*f)( a, a0, xs, size );
                }
            }
            sbsc->n_requests[ sbsc->queue_start ] = 0;
            sbsc->queue_start = (sbsc->queue_start+common_step-sbsc->current) % sbsc->horizon;
        }
        if ( common_step == bsc_flush ) {
            assert( sbsc->total_n_outstanding_requests == 0 );
            sbsc->current = 0;
            sbsc->queue_start = 0;
            break;
        }
        sbsc->current = common_step ;
    }

    return sbsc->current;
}